

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

Result __thiscall
testing::internal::
FunctionMocker<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
::PerformDefaultAction
          (FunctionMocker<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
           *this,ArgumentTuple *args,string *call_description)

{
  OnCallSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  *this_00;
  pointer pcVar1;
  bool bVar2;
  Result RVar3;
  undefined1 uVar4;
  Action<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
  *this_01;
  __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  __tmp;
  pointer ppvVar5;
  string message;
  long *local_60 [2];
  long local_50 [2];
  ArgumentTuple local_40;
  
  ppvVar5 = (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
            super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  while (ppvVar5 !=
         (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
         super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
         super__Vector_impl_data._M_start) {
    this_00 = (OnCallSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
               *)ppvVar5[-1];
    ppvVar5 = ppvVar5 + -1;
    bVar2 = OnCallSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
            ::Matches(this_00,args);
    if (bVar2) {
      this_01 = OnCallSpec<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
                ::GetAction(this_00);
      local_40.
      super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
      .
      super__Tuple_impl<1UL,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
      .
      super__Tuple_impl<2UL,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
           = (args->
             super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
             ).
             super__Tuple_impl<1UL,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
             .
             super__Tuple_impl<2UL,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
      ;
      local_40.
      super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
      .
      super__Tuple_impl<1UL,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
      .super__Head_base<1UL,_unsigned_long,_false>._M_head_impl =
           (args->
           super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
           ).
           super__Tuple_impl<1UL,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
           .super__Head_base<1UL,_unsigned_long,_false>._M_head_impl;
      local_40.
      super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
      .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl =
           (args->
           super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode>
           ).super__Head_base<0UL,_unsigned_long,_false>._M_head_impl;
      RVar3 = Action<bool_(unsigned_long,_unsigned_long,_pstore::file::file_base::lock_kind,_pstore::file::file_base::blocking_mode)>
              ::Perform(this_01,&local_40);
      return RVar3;
    }
  }
  pcVar1 = (call_description->_M_dataplus)._M_p;
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_60,pcVar1,pcVar1 + call_description->_M_string_length);
  std::__cxx11::string::append((char *)local_60);
  if (DefaultValue<bool>::producer_ == (long *)0x0) {
    uVar4 = 0;
  }
  else {
    uVar4 = (**(code **)(*DefaultValue<bool>::producer_ + 0x10))();
  }
  if (local_60[0] == local_50) {
    return (Result)uVar4;
  }
  operator_delete(local_60[0],local_50[0] + 1);
  return (Result)uVar4;
}

Assistant:

Result PerformDefaultAction(ArgumentTuple&& args,
                              const std::string& call_description) const {
    const OnCallSpec<F>* const spec =
        this->FindOnCallSpec(args);
    if (spec != nullptr) {
      return spec->GetAction().Perform(std::move(args));
    }
    const std::string message =
        call_description +
        "\n    The mock function has no default action "
        "set, and its return type has no default value set.";
#if GTEST_HAS_EXCEPTIONS
    if (!DefaultValue<Result>::Exists()) {
      throw std::runtime_error(message);
    }
#else
    Assert(DefaultValue<Result>::Exists(), "", -1, message);
#endif
    return DefaultValue<Result>::Get();
  }